

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast_t.cpp
# Opt level: O3

void __thiscall deci::ast_t::~ast_t(ast_t *this)

{
  pointer ppaVar1;
  pointer ppaVar2;
  
  ppaVar2 = (this->statements).
            super__Vector_base<deci::ast_item_t_*,_std::allocator<deci::ast_item_t_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppaVar1 = (this->statements).
            super__Vector_base<deci::ast_item_t_*,_std::allocator<deci::ast_item_t_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppaVar2 != ppaVar1) {
    do {
      if (*ppaVar2 != (ast_item_t *)0x0) {
        (*(*ppaVar2)->_vptr_ast_item_t[4])();
      }
      ppaVar2 = ppaVar2 + 1;
    } while (ppaVar2 != ppaVar1);
    ppaVar2 = (this->statements).
              super__Vector_base<deci::ast_item_t_*,_std::allocator<deci::ast_item_t_*>_>._M_impl.
              super__Vector_impl_data._M_start;
  }
  if (ppaVar2 != (pointer)0x0) {
    operator_delete(ppaVar2);
  }
  (this->super_ast_item_t)._vptr_ast_item_t = (_func_int **)&PTR_EndLocationTag_abi_cxx11__0011d3c8;
  return;
}

Assistant:

ast_t::~ast_t() {
    for (auto item: this->statements) {
      delete item;
    }
  }